

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFA.hpp
# Opt level: O2

void __thiscall Centaurus::DFAState<char>::print(DFAState<char> *this,wostream *os,int from)

{
  pointer pNVar1;
  wostream *pwVar2;
  NFATransition<char> *t;
  pointer pNVar3;
  
  pNVar1 = (this->super_NFABaseState<char,_Centaurus::IndexVector>).m_transitions.
           super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pNVar3 = (this->super_NFABaseState<char,_Centaurus::IndexVector>).m_transitions.
                super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pNVar3 != pNVar1; pNVar3 = pNVar3 + 1) {
    pwVar2 = std::operator<<(os,L"S");
    pwVar2 = (wostream *)std::wostream::operator<<((wostream *)pwVar2,from);
    pwVar2 = std::operator<<(pwVar2,L" -> ");
    pwVar2 = std::operator<<(pwVar2,L"S");
    pwVar2 = (wostream *)std::wostream::operator<<((wostream *)pwVar2,pNVar3->m_dest);
    std::operator<<(pwVar2,L" [ label=\"");
    operator<<(os,&pNVar3->m_label);
    pwVar2 = std::operator<<(os,L"\" ];");
    std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar2);
  }
  return;
}

Assistant:

virtual void print(std::wostream& os, int from) const override
	{
		for (const auto& t : m_transitions)
		{
			os << L"S" << from << L" -> " << L"S" << t.dest() << L" [ label=\"";
			os << t.label();
			os << L"\" ];" << std::endl;
		}
	}